

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void anon_unknown.dwarf_1ed46f2::sha256::Initialize(uint32_t *s)

{
  long lVar1;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0x6a09e667;
  in_RDI[1] = 0xbb67ae85;
  in_RDI[2] = 0x3c6ef372;
  in_RDI[3] = 0xa54ff53a;
  in_RDI[4] = 0x510e527f;
  in_RDI[5] = 0x9b05688c;
  in_RDI[6] = 0x1f83d9ab;
  in_RDI[7] = 0x5be0cd19;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void inline Initialize(uint32_t* s)
{
    s[0] = 0x6a09e667ul;
    s[1] = 0xbb67ae85ul;
    s[2] = 0x3c6ef372ul;
    s[3] = 0xa54ff53aul;
    s[4] = 0x510e527ful;
    s[5] = 0x9b05688cul;
    s[6] = 0x1f83d9abul;
    s[7] = 0x5be0cd19ul;
}